

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O2

string * util::toLower(string *__return_storage_ptr__,string *in)

{
  pointer pcVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  size_type sVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  pcVar1 = (in->_M_dataplus)._M_p;
  sVar2 = in->_M_string_length;
  pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
    iVar4 = tolower((int)pcVar1[sVar5]);
    pcVar3[sVar5] = (char)iVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toLower(const std::string& in) {
  std::string out;
  out.resize(in.size());
  std::transform(in.begin(), in.end(), out.begin(), ::tolower);
  return out;
}